

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O3

int vkt::tessellation::referencePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,bool usePointMode,
              float *innerLevels,float *outerLevels)

{
  ulong uVar1;
  float fVar2;
  long lVar3;
  DrawFunction DVar4;
  DrawFunction DVar5;
  DrawFunction DVar6;
  DrawFunction DVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  undefined7 in_register_00000011;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  DrawFunction DVar24;
  DrawFunction DVar25;
  DrawFunction DVar26;
  DrawFunction DVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int outer_2 [3];
  int iStack_5c;
  pointer local_58;
  int outer [3];
  int local_3c;
  int inner;
  int local_2c;
  
  if ((int)CONCAT71(in_register_00000011,usePointMode) == 0) {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) {
      return 0;
    }
    fVar14 = *outerLevels;
    if (fVar14 <= 0.0) {
      return 0;
    }
    uVar12 = 0;
    do {
      if (*(ulong *)(&DAT_00b20d90 + (ulong)primitiveType * 8) - 1 == uVar12) goto LAB_0079493c;
      uVar1 = uVar12 + 1;
      lVar3 = uVar12 + 1;
      uVar12 = uVar1;
    } while (0.0 < outerLevels[lVar3]);
    if (*(ulong *)(&DAT_00b20d90 + (ulong)primitiveType * 8) <= uVar1) {
LAB_0079493c:
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar2 = 1.0;
        if (1.0 <= fVar14) {
          fVar2 = fVar14;
        }
        fVar14 = ceilf(fVar2);
        iVar8 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        return iVar8 * (int)fVar14;
      }
      if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        if (outer[0] == 1 || outer[1] == 1) {
          if ((((outer[0] == 1) && (outer[1] == 1)) && (outer_2[0] == 1)) &&
             (((outer_2[1] == 1 && (outer_2[2] == 1)) && (iStack_5c == 1)))) {
            return 2;
          }
          uVar9 = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
          if (outer[0] < 2) {
            outer[0] = uVar9;
          }
          if (outer[1] < 2) {
            outer[1] = uVar9;
          }
        }
        return outer_2[2] + iStack_5c + outer_2[0] + outer_2[1] + outer[1] * 2 +
               (outer[1] - 1U) * (outer[0] * 2 + -4) + -4;
      }
      if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,outer,outer_2);
        if (outer[0] == 1) {
          if (outer_2[2] == 1 && (outer_2[1] == 1 && outer_2[0] == 1)) {
            return 1;
          }
          outer[0] = spacingMode == SPACINGMODE_FRACTIONAL_ODD | 2;
          uVar9 = outer_2[1] + outer_2[0] + outer_2[2];
          uVar11 = 1;
        }
        else {
          uVar9 = outer_2[1] + outer_2[0] + outer_2[2];
          if (outer[0] < 2) {
            return uVar9;
          }
          uVar11 = (uint)outer[0] >> 1;
        }
        uVar10 = uVar11 + 3 & 0xfffffffc;
        uVar11 = uVar11 - 1;
        DVar4 = FUNCTION_DRAW;
        DVar5 = FUNCTION_DRAW_INDEXED;
        DVar6 = FUNCTION_DRAW_INDIRECT;
        DVar7 = FUNCTION_DRAW_INDEXED_INDIRECT;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        do {
          uVar20 = uVar21;
          uVar18 = uVar19;
          uVar16 = uVar17;
          uVar15 = uVar9;
          DVar27 = DVar7;
          DVar26 = DVar6;
          DVar25 = DVar5;
          DVar24 = DVar4;
          auVar28._0_4_ = outer[0] + DVar24 * -2 + -2;
          auVar28._4_4_ = outer[0] + DVar25 * -2 + -2;
          auVar28._8_4_ = outer[0] + DVar26 * -2 + -2;
          auVar28._12_4_ = outer[0] + DVar27 * -2 + -2;
          auVar29._4_4_ = auVar28._4_4_;
          auVar29._0_4_ = auVar28._4_4_;
          auVar29._8_4_ = auVar28._12_4_;
          auVar29._12_4_ = auVar28._12_4_;
          uVar9 = (-(uint)(auVar28._0_4_ == 1) & 4 |
                  ~-(uint)(auVar28._0_4_ == 1) & auVar28._0_4_ * 6) + uVar15;
          uVar17 = (-(uint)(auVar28._4_4_ == 1) & 4 |
                   ~-(uint)(auVar28._4_4_ == 1) & auVar28._4_4_ * 6) + uVar16;
          uVar19 = (-(uint)(auVar28._8_4_ == 1) & 4 |
                   ~-(uint)(auVar28._8_4_ == 1) & (uint)((auVar28._8_8_ & 0xffffffff) * 6)) + uVar18
          ;
          uVar21 = (-(uint)(auVar28._12_4_ == 1) & 4 |
                   ~-(uint)(auVar28._12_4_ == 1) & (uint)((auVar29._8_8_ & 0xffffffff) * 6)) +
                   uVar20;
          uVar10 = uVar10 - 4;
          DVar4 = DVar24 + FUNTION_LAST;
          DVar5 = DVar25 + FUNTION_LAST;
          DVar6 = DVar26 + FUNTION_LAST;
          DVar7 = DVar27 + FUNTION_LAST;
        } while (uVar10 != 0);
        uVar10 = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(DVar24 ^ 0x80000000));
        uVar22 = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(DVar25 ^ 0x80000000));
        uVar23 = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(DVar26 ^ 0x80000000));
        uVar11 = -(uint)((int)(uVar11 ^ 0x80000000) < (int)(DVar27 ^ 0x80000000));
        return (~uVar11 & uVar21 | uVar20 & uVar11) + (~uVar22 & uVar17 | uVar16 & uVar22) +
               (~uVar23 & uVar19 | uVar18 & uVar23) + (~uVar10 & uVar9 | uVar15 & uVar10);
      }
    }
  }
  else {
    if (TESSPRIMITIVETYPE_ISOLINES < primitiveType) {
      return 0;
    }
    fVar14 = *outerLevels;
    if (fVar14 <= 0.0) {
      return 0;
    }
    uVar12 = 0;
    do {
      if (*(ulong *)(&DAT_00b20d90 + (ulong)primitiveType * 8) - 1 == uVar12) goto LAB_00794898;
      uVar1 = uVar12 + 1;
      lVar3 = uVar12 + 1;
      uVar12 = uVar1;
    } while (0.0 < outerLevels[lVar3]);
    if (*(ulong *)(&DAT_00b20d90 + (ulong)primitiveType * 8) <= uVar1) {
LAB_00794898:
      if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
        fVar2 = 1.0;
        if (1.0 <= fVar14) {
          fVar2 = fVar14;
        }
        fVar14 = ceilf(fVar2);
        iVar8 = getClampedRoundedTessLevel(spacingMode,outerLevels[1]);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_2
                   ,(int)fVar14,iVar8);
        pvVar13 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      else {
        if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
          getClampedRoundedQuadTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceQuadTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,local_2c,outer[0],outer[1],outer[2],local_3c);
        }
        else {
          if (primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
            return 0;
          }
          getClampedRoundedTriangleTessLevels(spacingMode,innerLevels,outerLevels,&inner,outer);
          generateReferenceTriangleTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     outer_2,spacingMode,inner,outer[0],outer[1],outer[2]);
        }
        pvVar13 = (void *)CONCAT44(outer_2[1],outer_2[0]);
      }
      if (pvVar13 != (void *)0x0) {
        operator_delete(pvVar13,(long)local_58 - (long)pvVar13);
      }
      return (int)((ulong)(CONCAT44(iStack_5c,outer_2[2]) - (long)pvVar13) >> 2) * -0x55555555;
    }
  }
  return 0;
}

Assistant:

int referencePrimitiveCount (const TessPrimitiveType primitiveType, const SpacingMode spacingMode, const bool usePointMode, const float* innerLevels, const float* outerLevels)
{
	return usePointMode ? referencePointModePrimitiveCount		(primitiveType, spacingMode, innerLevels, outerLevels)
						: referenceNonPointModePrimitiveCount	(primitiveType, spacingMode, innerLevels, outerLevels);
}